

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  _Invoker_type p_Var5;
  _Manager_type p_Var6;
  Column_dimension_option CVar7;
  ID_index IVar8;
  bool bVar9;
  ID_index IVar10;
  ID_index IVar11;
  ulong uVar12;
  long lVar13;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  *pIVar14;
  long lVar15;
  long lVar16;
  anon_class_1_0_00000001 local_43;
  anon_class_1_0_00000001 local_42;
  anon_class_1_0_00000001 local_41;
  uint local_40;
  Index local_3c;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var5 = this[1].deathComp_._M_invoker;
  lVar15 = (ulong)columnIndex1 * 0x40;
  uVar2 = *(uint *)(p_Var5 + lVar15 + 0x18);
  lVar16 = (ulong)columnIndex2 * 0x40;
  local_40 = *(uint *)(p_Var5 + lVar16 + 0x18);
  uVar12 = (ulong)local_40;
  local_38.targetColumn._0_4_ = uVar2;
  local_3c = columnIndex1;
  if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar9 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_38,&local_40);
  p_Var5 = this[1].deathComp_._M_invoker;
  if (bVar9) {
    lVar13 = uVar12 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
              *)(p_Var5 + lVar13);
    uVar3 = *(uint *)(p_Var5 + lVar13 + 0x14);
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + (ulong)uVar2 * 0x40);
    local_38.targetColumn = pIVar1;
    bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar14,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar9) {
      CVar7.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar11 = (pIVar1->super_Chain_column_option).pivot_;
      IVar10 = (pIVar14->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar14->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar10;
      pIVar14->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (pIVar14->super_Chain_column_option).pivot_ = IVar11;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar3 != uVar2) {
      p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
      uVar4 = *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4);
      *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4) = *(undefined4 *)(p_Var6 + (ulong)uVar2 * 4);
      *(undefined4 *)(p_Var6 + (ulong)uVar2 * 4) = uVar4;
    }
    p_Var5 = this[1].deathComp_._M_invoker;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
              *)(p_Var5 + lVar16);
    IVar10 = *(ID_index *)(p_Var5 + lVar16 + 0x14);
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + lVar15);
    local_38.targetColumn = pIVar1;
    bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar14,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar9) {
      CVar7.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar8 = (pIVar1->super_Chain_column_option).pivot_;
      IVar11 = (pIVar14->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar14->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar11;
      pIVar14->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (pIVar14->super_Chain_column_option).pivot_ = IVar8;
    }
    IVar11 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar10 == IVar11) {
      return local_3c;
    }
  }
  else {
    lVar13 = (ulong)uVar2 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
              *)(p_Var5 + lVar13);
    uVar2 = *(uint *)(p_Var5 + lVar13 + 0x14);
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + uVar12 * 0x40);
    local_3c = columnIndex2;
    local_38.targetColumn = pIVar1;
    bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar14,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar9) {
      CVar7.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar11 = (pIVar1->super_Chain_column_option).pivot_;
      IVar10 = (pIVar14->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar14->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar10;
      pIVar14->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (pIVar14->super_Chain_column_option).pivot_ = IVar11;
    }
    uVar3 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar2 != uVar3) {
      p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
      uVar4 = *(undefined4 *)(p_Var6 + (ulong)uVar2 * 4);
      *(undefined4 *)(p_Var6 + (ulong)uVar2 * 4) = *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4);
      *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4) = uVar4;
    }
    p_Var5 = this[1].deathComp_._M_invoker;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
              *)(p_Var5 + lVar15);
    IVar10 = *(ID_index *)(p_Var5 + lVar15 + 0x14);
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + lVar16);
    local_38.targetColumn = pIVar1;
    bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar14,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar9) {
      CVar7.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar8 = (pIVar1->super_Chain_column_option).pivot_;
      IVar11 = (pIVar14->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar14->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar11;
      pIVar14->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (pIVar14->super_Chain_column_option).pivot_ = IVar8;
    }
    IVar11 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar10 == IVar11) {
      return local_3c;
    }
  }
  p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
  uVar4 = *(undefined4 *)(p_Var6 + (ulong)IVar10 * 4);
  *(undefined4 *)(p_Var6 + (ulong)IVar10 * 4) = *(undefined4 *)(p_Var6 + (ulong)IVar11 * 4);
  *(undefined4 *)(p_Var6 + (ulong)IVar11 * 4) = uVar4;
  return local_3c;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}